

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O2

int WebRtcIsac_DecodeFrameLen(Bitstr *streamdata,int16_t *framesamples)

{
  int iVar1;
  int16_t iVar2;
  int frame_mode;
  
  iVar1 = WebRtcIsac_DecHistOneStepMulti
                    (&frame_mode,streamdata,WebRtcIsac_kFrameLengthCdf_ptr,
                     WebRtcIsac_kFrameLengthInitIndex,1);
  if (iVar1 < 0) {
    iVar1 = -0x19f0;
  }
  else {
    if (frame_mode == 1) {
      iVar2 = 0x1e0;
    }
    else {
      if (frame_mode != 2) {
        return -0x19e6;
      }
      iVar2 = 0x3c0;
    }
    *framesamples = iVar2;
  }
  return iVar1;
}

Assistant:

int WebRtcIsac_DecodeFrameLen(Bitstr* streamdata, int16_t* framesamples) {
  int frame_mode, err;
  err = 0;
  /* entropy decoding of frame length [1:30ms,2:60ms] */
  err = WebRtcIsac_DecHistOneStepMulti(&frame_mode, streamdata,
                                       WebRtcIsac_kFrameLengthCdf_ptr,
                                       WebRtcIsac_kFrameLengthInitIndex, 1);
  if (err < 0)
    return -ISAC_RANGE_ERROR_DECODE_FRAME_LENGTH;

  switch (frame_mode) {
    case 1:
      *framesamples = 480; /* 30ms */
      break;
    case 2:
      *framesamples = 960; /* 60ms */
      break;
    default:
      err = -ISAC_DISALLOWED_FRAME_MODE_DECODER;
  }
  return err;
}